

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceDecomposition::ForceDecomposition
          (ForceDecomposition *this,SimInfo *info,InteractionManager *iMan)

{
  vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *this_00;
  SnapshotManager *pSVar1;
  Globals *pGVar2;
  pointer pVVar3;
  int iVar4;
  Vector3<int> local_40;
  
  this->_vptr_ForceDecomposition = (_func_int **)&PTR__ForceDecomposition_002ac358;
  this->info_ = info;
  this->interactionMan_ = iMan;
  this->needVelocities_ = false;
  (this->cellList_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cellList_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cellList_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&this->idents,0,0x234);
  pSVar1 = info->sman_;
  this->sman_ = pSVar1;
  iVar4 = pSVar1->rigidBodyStorageLayout_;
  this->atomStorageLayout_ = pSVar1->atomStorageLayout_;
  this->rigidBodyStorageLayout_ = iVar4;
  this->cutoffGroupStorageLayout_ = pSVar1->cutoffGroupStorageLayout_;
  this->ff_ = info->forceField_;
  pGVar2 = info->simParams_;
  this->usePeriodicBoundaryConditions_ =
       (bool)(pGVar2->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  if (((pGVar2->PrintHeatFlux).super_ParameterBase.empty_ == false) &&
     ((pGVar2->PrintHeatFlux).super_ParameterBase.field_0x2b == '\x01')) {
    this->needVelocities_ = true;
  }
  this_00 = &this->cellOffsets_;
  if ((pGVar2->SkinThickness).super_ParameterBase.empty_ == false) {
    this->skinThickness_ = (pGVar2->SkinThickness).data_;
  }
  else {
    this->skinThickness_ = 1.0;
    snprintf(painCave.errMsg,2000,
             "ForceDecomposition: No value was set for the skinThickness.\n\tOpenMD will use a default value of %f Angstroms\n\tfor this simulation\n"
             ,0);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  pVVar3 = (this->cellOffsets_).
           super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cellOffsets_).
      super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar3) {
    (this->cellOffsets_).
    super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  local_40.super_Vector<int,_3U>.data_[2] = 0;
  local_40.super_Vector<int,_3U>.data_[0] = 0;
  local_40.super_Vector<int,_3U>.data_[1] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[2] = 0;
  local_40.super_Vector<int,_3U>.data_[0] = 1;
  local_40.super_Vector<int,_3U>.data_[1] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[2] = 0;
  local_40.super_Vector<int,_3U>.data_[0] = 1;
  local_40.super_Vector<int,_3U>.data_[1] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[2] = 0;
  local_40.super_Vector<int,_3U>.data_[0] = 0;
  local_40.super_Vector<int,_3U>.data_[1] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[2] = 0;
  local_40.super_Vector<int,_3U>.data_[0] = -1;
  local_40.super_Vector<int,_3U>.data_[1] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = 0;
  local_40.super_Vector<int,_3U>.data_[1] = 0;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = 1;
  local_40.super_Vector<int,_3U>.data_[1] = 0;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = 1;
  local_40.super_Vector<int,_3U>.data_[1] = 1;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = 0;
  local_40.super_Vector<int,_3U>.data_[1] = 1;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = -1;
  local_40.super_Vector<int,_3U>.data_[1] = 1;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = -1;
  local_40.super_Vector<int,_3U>.data_[1] = 0;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = -1;
  local_40.super_Vector<int,_3U>.data_[1] = -1;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = 0;
  local_40.super_Vector<int,_3U>.data_[1] = -1;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  local_40.super_Vector<int,_3U>.data_[0] = 1;
  local_40.super_Vector<int,_3U>.data_[1] = -1;
  local_40.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_40)
  ;
  return;
}

Assistant:

ForceDecomposition::ForceDecomposition(SimInfo* info,
                                         InteractionManager* iMan) :
      info_(info),
      interactionMan_(iMan), needVelocities_(false) {
    sman_                     = info_->getSnapshotManager();
    atomStorageLayout_        = sman_->getAtomStorageLayout();
    rigidBodyStorageLayout_   = sman_->getRigidBodyStorageLayout();
    cutoffGroupStorageLayout_ = sman_->getCutoffGroupStorageLayout();
    ff_                       = info_->getForceField();

    usePeriodicBoundaryConditions_ =
        info->getSimParams()->getUsePeriodicBoundaryConditions();

    Globals* simParams_ = info_->getSimParams();
    if (simParams_->havePrintHeatFlux()) {
      if (simParams_->getPrintHeatFlux()) { needVelocities_ = true; }
    }

    if (simParams_->haveSkinThickness()) {
      skinThickness_ = simParams_->getSkinThickness();
    } else {
      skinThickness_ = 1.0;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ForceDecomposition: No value was set for the skinThickness.\n"
               "\tOpenMD will use a default value of %f Angstroms\n"
               "\tfor this simulation\n",
               skinThickness_);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    // cellOffsets are the partial space for the cell lists used in
    // constructing the neighbor lists
    cellOffsets_.clear();
    cellOffsets_.push_back(Vector3i(0, 0, 0));
    cellOffsets_.push_back(Vector3i(1, 0, 0));
    cellOffsets_.push_back(Vector3i(1, 1, 0));
    cellOffsets_.push_back(Vector3i(0, 1, 0));
    cellOffsets_.push_back(Vector3i(-1, 1, 0));
    cellOffsets_.push_back(Vector3i(0, 0, 1));
    cellOffsets_.push_back(Vector3i(1, 0, 1));
    cellOffsets_.push_back(Vector3i(1, 1, 1));
    cellOffsets_.push_back(Vector3i(0, 1, 1));
    cellOffsets_.push_back(Vector3i(-1, 1, 1));
    cellOffsets_.push_back(Vector3i(-1, 0, 1));
    cellOffsets_.push_back(Vector3i(-1, -1, 1));
    cellOffsets_.push_back(Vector3i(0, -1, 1));
    cellOffsets_.push_back(Vector3i(1, -1, 1));
  }